

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_RepeatedFieldMapTest_CustomMapKeyComparator_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldMapTest_CustomMapKeyComparator_Test *this)

{
  bool bVar1;
  TestDiffMessage_Item *pTVar2;
  uint32_t *puVar3;
  Arena *pAVar4;
  FieldDescriptor *pFVar5;
  char *pcVar6;
  char *in_R9;
  AssertHelper local_4c0;
  Message local_4b8;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_480;
  Message local_478;
  bool local_469;
  undefined1 local_468 [8];
  AssertionResult gtest_ar__1;
  string local_450;
  AssertHelper local_430;
  Message local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar;
  AssertHelper local_3f0;
  Message local_3e8;
  bool local_3d9;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_;
  string output;
  string local_3a0;
  MapKeyComparator local_380;
  ValueProductMapKeyComparator key_comparator;
  MessageDifferencer differencer;
  Item *item;
  undefined1 local_1b0 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencerTest_RepeatedFieldMapTest_CustomMapKeyComparator_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_1b0);
  pTVar2 = proto2_unittest::TestDiffMessage::add_item
                     ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  proto2_unittest::TestDiffMessage_Item::add_ra(pTVar2,6);
  proto2_unittest::TestDiffMessage_Item::add_ra(pTVar2,0x23);
  puVar3 = internal::HasBits<1>::operator[](&(pTVar2->field_0)._impl_._has_bits_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
  internal::ArenaStringPtr::Set(&(pTVar2->field_0)._impl_.b_,"hello",pAVar4);
  pTVar2 = proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_1b0);
  proto2_unittest::TestDiffMessage_Item::add_ra(pTVar2,10);
  proto2_unittest::TestDiffMessage_Item::add_ra(pTVar2,0x15);
  puVar3 = internal::HasBits<1>::operator[](&(pTVar2->field_0)._impl_._has_bits_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
  internal::ArenaStringPtr::Set(&(pTVar2->field_0)._impl_.b_,"hello",pAVar4);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&key_comparator);
  ValueProductMapKeyComparator::ValueProductMapKeyComparator
            ((ValueProductMapKeyComparator *)&local_380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"item",(allocator<char> *)(output.field_2._M_local_buf + 0xf));
  pFVar5 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_3a0);
  util::MessageDifferencer::TreatAsMapUsingKeyComparator
            ((MessageDifferencer *)&key_comparator,pFVar5,&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)&key_comparator,(string *)&gtest_ar_.message_);
  bVar1 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)&key_comparator,(Message *)((long)&msg2.field_0 + 0xa0),
                     (Message *)local_1b0);
  local_3d9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d8,&local_3d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_3d8,(AssertionResult *)0x1ebd035,
               "true","false",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9a1,pcVar6);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  testing::internal::EqHelper::
  Compare<char[68],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_420,
             "\"modified: item[0].ra[0]: 6 -> 10\\n\" \"modified: item[0].ra[1]: 35 -> 21\\n\"",
             "output",(char (*) [68])
                      "modified: item[0].ra[0]: 6 -> 10\nmodified: item[0].ra[1]: 35 -> 21\n",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9a5,pcVar6);
    testing::internal::AssertHelper::operator=(&local_430,&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"item.ra",
             (allocator<char> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pFVar5 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_450);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)&key_comparator,pFVar5);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  std::__cxx11::string::clear();
  local_469 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)&key_comparator,
                         (Message *)((long)&msg2.field_0 + 0xa0),(Message *)local_1b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_468,&local_469,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_468,(AssertionResult *)0x1ebd035,
               "false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9a9,pcVar6);
    testing::internal::AssertHelper::operator=(&local_480,&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  testing::internal::EqHelper::
  Compare<char[21],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_4b0,"\"ignored: item[0].ra\\n\"","output",
             (char (*) [21])"ignored: item[0].ra\n",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4b8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9aa,pcVar6);
    testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper(&local_4c0);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  ValueProductMapKeyComparator::~ValueProductMapKeyComparator
            ((ValueProductMapKeyComparator *)&local_380);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&key_comparator);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_1b0);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldMapTest_CustomMapKeyComparator) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  // Treat "item" as Map, using custom key comparator to determine if two
  // elements have the same key.
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  item->add_ra(6);
  item->add_ra(35);
  item->set_b("hello");
  item = msg2.add_item();
  item->add_ra(10);
  item->add_ra(21);
  item->set_b("hello");
  util::MessageDifferencer differencer;
  ValueProductMapKeyComparator key_comparator;
  differencer.TreatAsMapUsingKeyComparator(GetFieldDescriptor(msg1, "item"),
                                           &key_comparator);
  std::string output;
  differencer.ReportDifferencesToString(&output);
  // Though the above two messages have different values for item.ra, they
  // are regarded as having the same key because 6 * 35 == 10 * 21. That's
  // how the key comparator determines if the two have the same key.
  // However, in value comparison, all fields of the message are taken into
  // consideration, so they are different because their item.ra fields have
  // different values using normal value comparison.
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "modified: item[0].ra[0]: 6 -> 10\n"
      "modified: item[0].ra[1]: 35 -> 21\n",
      output);
  differencer.IgnoreField(GetFieldDescriptor(msg1, "item.ra"));
  output.clear();
  // item.ra is ignored in value comparison, so the two messages equal.
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
  EXPECT_EQ("ignored: item[0].ra\n", output);
}